

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLGrammarPoolImpl.cpp
# Opt level: O2

void __thiscall xercesc_4_0::XMLGrammarPoolImpl::~XMLGrammarPoolImpl(XMLGrammarPoolImpl *this)

{
  RefHashTableOf<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher> *this_00;
  XSModel *this_01;
  void *in_RSI;
  
  (this->super_XMLGrammarPool)._vptr_XMLGrammarPool =
       (_func_int **)&PTR__XMLGrammarPoolImpl_004011d0;
  this_00 = this->fGrammarRegistry;
  if (this_00 != (RefHashTableOf<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher> *)0x0) {
    RefHashTableOf<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher>::~RefHashTableOf(this_00);
  }
  XMemory::operator_delete((XMemory *)this_00,in_RSI);
  if (this->fStringPool != (XMLStringPool *)0x0) {
    (*(this->fStringPool->super_XSerializable)._vptr_XSerializable[1])();
  }
  if (this->fSynchronizedStringPool != (XMLSynchronizedStringPool *)0x0) {
    (*(this->fSynchronizedStringPool->super_XMLStringPool).super_XSerializable._vptr_XSerializable
      [1])();
  }
  this_01 = this->fXSModel;
  if (this_01 != (XSModel *)0x0) {
    XSModel::~XSModel(this_01);
    XMemory::operator_delete((XMemory *)this_01,in_RSI);
    return;
  }
  return;
}

Assistant:

XMLGrammarPoolImpl::~XMLGrammarPoolImpl()
{
    delete fGrammarRegistry;
    delete fStringPool;
    if(fSynchronizedStringPool)
        delete fSynchronizedStringPool;
    if(fXSModel)
        delete fXSModel;
}